

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronization.cc
# Opt level: O0

void __thiscall
tchecker::system::synchronization_t::add_synchronization_constraint
          (synchronization_t *this,sync_constraint_t *constr)

{
  bool bVar1;
  process_id_t pVar2;
  process_id_t pVar3;
  reference this_00;
  invalid_argument *this_01;
  sync_constraint_t *c;
  iterator __end2;
  iterator __begin2;
  vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  *__range2;
  sync_constraint_t *constr_local;
  synchronization_t *this_local;
  
  __end2 = std::
           vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
           ::begin(&this->_constraints);
  c = (sync_constraint_t *)
      std::
      vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
      ::end(&this->_constraints);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
                                *)&c);
    if (!bVar1) {
      std::
      vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
      ::push_back(&this->_constraints,constr);
      return;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
              ::operator*(&__end2);
    pVar2 = sync_constraint_t::pid(this_00);
    pVar3 = sync_constraint_t::pid(constr);
    if (pVar2 == pVar3) break;
    __gnu_cxx::
    __normal_iterator<tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
    ::operator++(&__end2);
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"process is already synchronized");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void synchronization_t::add_synchronization_constraint(tchecker::system::sync_constraint_t const & constr)
{
  // Check that process is not synchronized yet
  for (tchecker::system::sync_constraint_t const & c : _constraints)
    if (c.pid() == constr.pid())
      throw std::invalid_argument("process is already synchronized");
  _constraints.push_back(constr);
}